

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O0

int bip32_key_from_seed(uchar *bytes,size_t bytes_len,uint32_t version,uint32_t flags,
                       ext_key *key_out)

{
  _Bool _Var1;
  int iVar2;
  undefined1 local_78 [8];
  sha512 sha;
  secp256k1_context *ctx;
  ext_key *key_out_local;
  uint32_t flags_local;
  uint32_t version_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if ((((bytes == (uchar *)0x0) || (_Var1 = is_valid_seed_len(bytes_len), !_Var1)) ||
      (_Var1 = version_is_valid(version,0), !_Var1)) ||
     (((flags & 0xfffffffd) != 0 || (key_out == (ext_key *)0x0)))) {
    bytes_local._4_4_ = -2;
  }
  else {
    wally_clear(key_out,0xc0);
    key_out->version = version;
    sha.u.u64[7] = (uint64_t)secp_ctx();
    if ((secp256k1_context *)sha.u.u64[7] == (secp256k1_context *)0x0) {
      bytes_local._4_4_ = -3;
    }
    else {
      hmac_sha512_impl((sha512 *)local_78,"Bitcoin seed",0xc,bytes,bytes_len);
      iVar2 = secp256k1_ec_seckey_verify((secp256k1_context *)sha.u.u64[7],local_78);
      if (iVar2 == 0) {
        wally_clear(local_78,0x40);
        bytes_local._4_4_ = -1;
      }
      else {
        key_out->priv_key[0] = '\0';
        *(undefined1 (*) [8])(key_out->priv_key + 1) = local_78;
        *(uint64_t *)(key_out->priv_key + 9) = sha.u.u64[0];
        *(uint64_t *)(key_out->priv_key + 0x11) = sha.u.u64[1];
        *(uint64_t *)(key_out->priv_key + 0x19) = sha.u.u64[2];
        iVar2 = key_compute_pub_key(key_out);
        if (iVar2 == 0) {
          *(uint64_t *)key_out->chain_code = sha.u.u64[3];
          *(uint64_t *)(key_out->chain_code + 8) = sha.u.u64[4];
          *(uint64_t *)(key_out->chain_code + 0x10) = sha.u.u64[5];
          *(uint64_t *)(key_out->chain_code + 0x18) = sha.u.u64[6];
          key_out->depth = '\0';
          key_out->child_num = 0;
          if ((flags & 2) == 0) {
            key_compute_hash160(key_out);
          }
          wally_clear(local_78,0x40);
          bytes_local._4_4_ = 0;
        }
        else {
          wally_clear_2(local_78,0x40,key_out,0xc0);
          bytes_local._4_4_ = -2;
        }
      }
    }
  }
  return bytes_local._4_4_;
}

Assistant:

int bip32_key_from_seed(const unsigned char *bytes, size_t bytes_len,
                        uint32_t version, uint32_t flags,
                        struct ext_key *key_out)
{
    const secp256k1_context *ctx;
    struct sha512 sha;

    if (!bytes || !is_valid_seed_len(bytes_len) ||
        !version_is_valid(version, BIP32_FLAG_KEY_PRIVATE) ||
        (flags & ~BIP32_FLAG_SKIP_HASH) || !key_out)
        return WALLY_EINVAL;

    wally_clear(key_out, sizeof(*key_out));
    key_out->version = version;

    if (!(ctx = secp_ctx()))
        return WALLY_ENOMEM;

    /* Generate private key and chain code */
    hmac_sha512_impl(&sha, SEED, sizeof(SEED), bytes, bytes_len);

    /* Check that the generated private key is valid */
    if (!secp256k1_ec_seckey_verify(ctx, sha.u.u8)) {
        wally_clear(&sha, sizeof(sha));
        return WALLY_ERROR; /* Invalid private key */
    }

    /* Copy the private key and set its prefix */
    key_out->priv_key[0] = BIP32_FLAG_KEY_PRIVATE;
    memcpy(key_out->priv_key + 1, sha.u.u8, sizeof(sha) / 2);
    if (key_compute_pub_key(key_out) != WALLY_OK) {
        wally_clear_2(&sha, sizeof(sha), key_out, sizeof(*key_out));
        return WALLY_EINVAL;
    }

    /* Copy the chain code */
    memcpy(key_out->chain_code, sha.u.u8 + sizeof(sha) / 2, sizeof(sha) / 2);

    key_out->depth = 0; /* Master key, depth 0 */
    key_out->child_num = 0;
    if (!(flags & BIP32_FLAG_SKIP_HASH))
        key_compute_hash160(key_out);
    wally_clear(&sha, sizeof(sha));
    return WALLY_OK;
}